

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# count_if_suite.cpp
# Opt level: O0

void count_array_arithmetic(void)

{
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_288;
  undefined4 local_280 [2];
  iterator local_278;
  iterator local_260;
  difference_type local_248 [2];
  undefined4 local_238 [2];
  iterator local_230;
  iterator local_218;
  difference_type local_200 [2];
  undefined4 local_1f0 [2];
  iterator local_1e8;
  iterator local_1d0;
  difference_type local_1b8 [3];
  basic_variable<std::allocator<char>_> *local_1a0;
  basic_variable<std::allocator<char>_> local_198;
  basic_variable<std::allocator<char>_> local_168;
  basic_variable<std::allocator<char>_> local_138;
  basic_variable<std::allocator<char>_> local_108;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_1a0 = &local_198;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_1a0,true);
  local_1a0 = &local_168;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<int>(local_1a0,1);
  local_1a0 = &local_138;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<double>(local_1a0,1.0);
  local_1a0 = &local_108;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,"alpha");
  local_1a0 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,L"bravo");
  local_1a0 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,L"charlie");
  local_1a0 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable(local_1a0,L"delta");
  local_48._0_8_ = &local_198;
  local_48._8_8_ = 7;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x7;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_288 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_288 = local_288 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_288);
  } while (local_288 != &local_198);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1d0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_1b8[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array_arithmetic()::__0>
                           (&local_1d0,&local_1e8);
  local_1f0[0] = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == true; })"
             ,"3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0xb2,"void count_array_arithmetic()",local_1b8,local_1f0);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1d0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_218,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_230,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_200[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array_arithmetic()::__1>
                           (&local_218,&local_230);
  local_238[0] = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == 1; })"
             ,"3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0xb5,"void count_array_arithmetic()",local_200,local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_230);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_218);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_260,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_278,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_248[0] = std::
                 count_if<trial::dynamic::basic_variable<std::allocator<char>>::iterator,count_array_arithmetic()::__2>
                           (&local_260,&local_278);
  local_280[0] = 3;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,long,int>
            ("std::count_if(data.begin(), data.end(), [] (const variable& value) { return value == 1.0; })"
             ,"3",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/count_if_suite.cpp"
             ,0xb8,"void count_array_arithmetic()",local_248,local_280);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_278);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_260);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void count_array_arithmetic()
{
    variable data = array::make({ true, 1, 1.0, "alpha", L"bravo", u"charlie", U"delta" });
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == true; }),
                              3);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == 1; }),
                              3);
    TRIAL_PROTOCOL_TEST_EQUAL(std::count_if(data.begin(), data.end(),
                                            [] (const variable& value) { return value == 1.0; }),
                              3);
}